

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

double * __thiscall ON_4dPoint::operator[](ON_4dPoint *this,uint i)

{
  ON_4dPoint *local_40;
  ON_4dPoint *local_38;
  ON_4dPoint *local_30;
  double *pd;
  uint i_local;
  ON_4dPoint *this_local;
  
  local_30 = this;
  if (i != 0) {
    if (i < 3) {
      if (i == 1) {
        local_40 = (ON_4dPoint *)&this->y;
      }
      else {
        local_40 = (ON_4dPoint *)&this->z;
      }
      local_38 = local_40;
    }
    else {
      local_38 = (ON_4dPoint *)&this->w;
    }
    local_30 = local_38;
  }
  return &local_30->x;
}

Assistant:

double& ON_4dPoint::operator[](unsigned int i)
{
  double* pd = (i<=0) ? &x : ( (i>=3) ? &w : (i==1)?&y:&z);
  return *pd;
}